

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O3

void __thiscall Debugger::EnterDebugMode(Debugger *this)

{
  bool bVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  _Elt_pointer psVar4;
  EmmyFacade *this_01;
  _Elt_pointer psVar5;
  unique_lock<std::mutex> lockEval;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_80;
  shared_ptr<EvalContext> local_70;
  shared_ptr<EvalContext> local_60;
  unique_lock *local_50;
  queue<std::shared_ptr<EvalContext>,_std::deque<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>_>
  *local_48;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->runMtx;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  this->blocking = true;
  local_48 = &this->evalQueue;
  local_50 = (unique_lock *)&this->cvRun;
  while( true ) {
    local_80._M_owns = false;
    local_80._M_device = &this->evalMtx;
    std::unique_lock<std::mutex>::lock(&local_80);
    local_80._M_owns = true;
    psVar4 = (this->evalQueue).c.
             super__Deque_base<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    psVar5 = (this->evalQueue).c.
             super__Deque_base<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if ((psVar5 == psVar4) && (this->blocking == true)) {
      std::unique_lock<std::mutex>::unlock(&local_80);
      std::condition_variable::wait(local_50);
      std::unique_lock<std::mutex>::lock(&local_80);
      psVar4 = (this->evalQueue).c.
               super__Deque_base<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      psVar5 = (this->evalQueue).c.
               super__Deque_base<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    }
    if (psVar5 == psVar4) break;
    peVar2 = (psVar4->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (psVar4->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    std::deque<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>::
    pop_front(&local_48->c);
    std::unique_lock<std::mutex>::unlock(&local_80);
    bVar1 = this->skipHook;
    this->skipHook = true;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_60.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    local_60.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00
    ;
    bVar3 = DoEval(this,&local_60);
    peVar2->success = bVar3;
    if (local_60.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    this->skipHook = bVar1;
    this_01 = EmmyFacade::Get();
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_70.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    local_70.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00
    ;
    EmmyFacade::OnEvalResult(this_01,&local_70);
    if (local_70.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_80);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_80);
  ClearCache(this);
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void Debugger::EnterDebugMode() {
	std::unique_lock<std::mutex> lock(runMtx);

	blocking = true;
	while (true) {
		std::unique_lock<std::mutex> lockEval(evalMtx);
		if (evalQueue.empty() && blocking) {
			lockEval.unlock();
			cvRun.wait(lock);
			lockEval.lock();
		}
		if (!evalQueue.empty()) {
			const auto evalContext = evalQueue.front();
			evalQueue.pop();
			lockEval.unlock();
			const bool skip = skipHook;
			skipHook = true;
			evalContext->success = DoEval(evalContext);
			skipHook = skip;
			EmmyFacade::Get().OnEvalResult(evalContext);
			continue;
		}
		break;
	}
	ClearCache();
}